

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O2

shared_ptr<vmips::Instruction>
vmips::Memory::create<vmips::lw>
          (shared_ptr<vmips::VirtReg> *target,shared_ptr<vmips::MemoryLocation> *location)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::Instruction> sVar2;
  shared_ptr<vmips::VirtReg> local_18;
  
  std::make_shared<vmips::lw,std::shared_ptr<vmips::VirtReg>,std::shared_ptr<vmips::MemoryLocation>>
            (&local_18,location);
  _Var1._M_pi = local_18.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_18.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       local_18.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (target->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var1._M_pi;
  local_18.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar2.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)target;
  return (shared_ptr<vmips::Instruction>)
         sVar2.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Instruction>
    Memory::create(std::shared_ptr<VirtReg> target, std::shared_ptr<MemoryLocation> location) {
        return std::make_shared<T>(std::move(target), std::move(location));
    }